

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>::
find<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry,capnp::_::RawSchema*&>
          (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
           *this,ArrayPtr<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
                 table,RawSchema **params)

{
  int iVar1;
  ArrayDisposer *pAVar2;
  uint uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  uint uVar5;
  Entry *pEVar6;
  ulong uVar7;
  RawSchema **in_R8;
  Maybe<unsigned_long> MVar8;
  
  pEVar6 = table.ptr;
  aVar4.value = table.size_;
  if ((pEVar6->value).dir.disposer != (Disposer *)0x0) {
    uVar3 = hashCode<capnp::_::RawSchema*&>(in_R8);
    pAVar2 = (pEVar6->key).parts.disposer;
    aVar4 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(pEVar6->value).dir.disposer
    ;
    uVar5 = (int)aVar4.value - 1U & uVar3;
    while( true ) {
      uVar7 = (ulong)uVar5;
      iVar1 = *(int *)((long)&pAVar2[uVar7]._vptr_ArrayDisposer + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)&pAVar2[uVar7]._vptr_ArrayDisposer == uVar3)) &&
         (*(RawSchema **)(table.size_ + (ulong)(iVar1 - 2) * 0x28) == *in_R8)) {
        *this = (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_001a15cb;
      }
      uVar5 = (uint)(uVar7 + 1);
      if (uVar7 + 1 == aVar4.value) {
        uVar5 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Callbacks>)
          0x0;
LAB_001a15cb:
  MVar8.ptr.field_1.value = aVar4.value;
  MVar8.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar8.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }